

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

void qpdf_oh_begin_dict_key_iter(qpdf_data qpdf,qpdf_oh oh)

{
  _Rb_tree_header *__x;
  undefined1 this [8];
  uint uVar1;
  char *cstr;
  Pipeline *this_00;
  qpdf_error_code_e local_198 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  undefined1 local_188 [8];
  function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(_qpdf_data_*)>
  local_180;
  int local_15c;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f0;
  long local_e0;
  undefined8 uStack_d8;
  qpdf_oh local_d0;
  function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_()>
  local_c8;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1408:9)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1408:9)>
             ::_M_manager;
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140 = std::
              _Function_handler<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1409:9)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1409:9)>
              ::_M_manager;
  std::
  function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_()>
  ::function(&local_c8,
             (function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_()>
              *)&local_a8);
  std::
  function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(QPDFObjectHandle_&)>
  ::function((function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(QPDFObjectHandle_&)>
              *)&local_f0,
             (function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(QPDFObjectHandle_&)>
              *)&local_158);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_128 = (code *)0x0;
  pcStack_120 = (code *)0x0;
  local_d0 = oh;
  local_138._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_138._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_138._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_138._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_138._M_unused._0_8_ + 0x18) = uStack_d8;
  if (local_e0 != 0) {
    *(void **)local_138._M_unused._0_8_ = local_f0._M_unused._M_object;
    *(undefined8 *)((long)local_138._M_unused._0_8_ + 8) = local_f0._8_8_;
    *(long *)((long)local_138._M_unused._0_8_ + 0x10) = local_e0;
    local_e0 = 0;
    uStack_d8 = 0;
  }
  *(qpdf_oh *)((long)local_138._M_unused._0_8_ + 0x20) = oh;
  pcStack_120 = std::
                _Function_handler<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
                ::_M_invoke;
  __x = &ret._M_t._M_impl.super__Rb_tree_header;
  ret._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ret._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ret._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128 = std::
              _Function_handler<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
              ::_M_manager;
  local_188 = (undefined1  [8])&ret;
  ret._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__x->_M_header;
  ret._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__x->_M_header;
  std::
  function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(_qpdf_data_*)>
  ::function(&local_180,
             (function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(_qpdf_data_*)>
              *)&local_138);
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_118._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_118._M_unused._0_8_ = local_188;
  *(long *)((long)local_118._M_unused._0_8_ + 8) = 0;
  *(long *)((long)local_118._M_unused._0_8_ + 0x10) = 0;
  *(long *)((long)local_118._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_118._M_unused._0_8_ + 0x20) = local_180._M_invoker;
  if (local_180.super__Function_base._M_manager != (_Manager_type)0x0) {
    *(void **)((long)local_118._M_unused._0_8_ + 8) =
         local_180.super__Function_base._M_functor._M_unused._M_object;
    *(undefined8 *)((long)local_118._M_unused._0_8_ + 0x10) =
         local_180.super__Function_base._M_functor._8_8_;
    *(_Manager_type *)((long)local_118._M_unused._0_8_ + 0x18) =
         local_180.super__Function_base._M_manager;
    local_180.super__Function_base._M_manager = (_Manager_type)0x0;
    local_180._M_invoker = (_Invoker_type)0x0;
  }
  pcStack_100 = std::
                _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
              ::_M_manager;
  uVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  std::_Function_base::~_Function_base(&local_180.super__Function_base);
  if (uVar1 < 2) {
    std::_Rb_tree_header::_Rb_tree_header(&local_50._M_impl.super__Rb_tree_header,__x);
  }
  else {
    if (qpdf->silence_errors == false) {
      if (qpdf->oh_error_occurred == false) {
        local_198[0] = qpdf_e_internal;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_188,
                   (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_15c = 0;
        std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
        emplace_back<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                  ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf->warnings,local_198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   (char (*) [1])0x22bf18,&local_15c,
                   (char (*) [129])
                   "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                  );
        std::__cxx11::string::~string((string *)local_188);
        qpdf->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_188,SUB41(local_198[0],0));
      this = local_188;
      cstr = (char *)(**(code **)(*(long *)(qpdf->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190);
    }
    std::
    function<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_()>
    ::operator()((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_50,&local_c8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&ret._M_t);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  std::_Function_base::~_Function_base((_Function_base *)&local_f0);
  std::_Function_base::~_Function_base(&local_c8.super__Function_base);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(qpdf->cur_iter_dict_keys)._M_t,&local_50);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_158);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  (qpdf->dict_iter)._M_node =
       (qpdf->cur_iter_dict_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  return;
}

Assistant:

void
qpdf_oh_begin_dict_key_iter(qpdf_data qpdf, qpdf_oh oh)
{
    qpdf->cur_iter_dict_keys = do_with_oh<std::set<std::string>>(
        qpdf,
        oh,
        []() { return std::set<std::string>(); },
        [](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_begin_dict_key_iter");
            return o.getKeys();
        });
    qpdf->dict_iter = qpdf->cur_iter_dict_keys.begin();
}